

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_hash_finish(psa_hash_operation_t *operation,uint8_t *hash,size_t hash_size,size_t *hash_length)

{
  uint uVar1;
  int ret;
  psa_status_t pVar2;
  ulong uVar3;
  
  uVar1 = operation->alg - 1;
  if (((byte)uVar1 < 0x12) && ((0x39f9fU >> (uVar1 & 0x1f) & 1) != 0)) {
    uVar3 = *(ulong *)(&DAT_00154998 + (ulong)(uVar1 & 0xff) * 8);
  }
  else {
    uVar3 = (ulong)((operation->alg & 0xff) == 0x13) << 6;
  }
  *hash_length = hash_size;
  if (hash_size != 0) {
    memset(hash,0x21,hash_size);
  }
  pVar2 = -0x8a;
  if (uVar3 <= hash_size) {
    pVar2 = -0x89;
    switch(operation->alg) {
    case 0x1000003:
      ret = mbedtls_md5_finish_ret(&(operation->ctx).md5,hash);
      break;
    case 0x1000004:
      ret = mbedtls_ripemd160_finish_ret(&(operation->ctx).ripemd160,hash);
      break;
    case 0x1000005:
      ret = mbedtls_sha1_finish_ret(&(operation->ctx).sha1,hash);
      break;
    default:
      goto switchD_00127520_caseD_1000006;
    case 0x1000008:
    case 0x1000009:
      ret = mbedtls_sha256_finish_ret(&(operation->ctx).sha256,hash);
      break;
    case 0x100000a:
    case 0x100000b:
      ret = mbedtls_sha512_finish_ret(&(operation->ctx).sha512,hash);
    }
    pVar2 = mbedtls_to_psa_error(ret);
    if (pVar2 == 0) {
      *hash_length = uVar3;
      pVar2 = psa_hash_abort(operation);
      return pVar2;
    }
  }
  psa_hash_abort(operation);
switchD_00127520_caseD_1000006:
  return pVar2;
}

Assistant:

psa_status_t psa_hash_finish( psa_hash_operation_t *operation,
                              uint8_t *hash,
                              size_t hash_size,
                              size_t *hash_length )
{
    psa_status_t status;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t actual_hash_length = PSA_HASH_SIZE( operation->alg );

    /* Fill the output buffer with something that isn't a valid hash
     * (barring an attack on the hash and deliberately-crafted input),
     * in case the caller doesn't check the return status properly. */
    *hash_length = hash_size;
    /* If hash_size is 0 then hash may be NULL and then the
     * call to memset would have undefined behavior. */
    if( hash_size != 0 )
        memset( hash, '!', hash_size );

    if( hash_size < actual_hash_length )
    {
        status = PSA_ERROR_BUFFER_TOO_SMALL;
        goto exit;
    }

    switch( operation->alg )
    {
#if defined(MBEDTLS_MD2_C)
        case PSA_ALG_MD2:
            ret = mbedtls_md2_finish_ret( &operation->ctx.md2, hash );
            break;
#endif
#if defined(MBEDTLS_MD4_C)
        case PSA_ALG_MD4:
            ret = mbedtls_md4_finish_ret( &operation->ctx.md4, hash );
            break;
#endif
#if defined(MBEDTLS_MD5_C)
        case PSA_ALG_MD5:
            ret = mbedtls_md5_finish_ret( &operation->ctx.md5, hash );
            break;
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case PSA_ALG_RIPEMD160:
            ret = mbedtls_ripemd160_finish_ret( &operation->ctx.ripemd160, hash );
            break;
#endif
#if defined(MBEDTLS_SHA1_C)
        case PSA_ALG_SHA_1:
            ret = mbedtls_sha1_finish_ret( &operation->ctx.sha1, hash );
            break;
#endif
#if defined(MBEDTLS_SHA256_C)
        case PSA_ALG_SHA_224:
        case PSA_ALG_SHA_256:
            ret = mbedtls_sha256_finish_ret( &operation->ctx.sha256, hash );
            break;
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
        case PSA_ALG_SHA_384:
#endif
        case PSA_ALG_SHA_512:
            ret = mbedtls_sha512_finish_ret( &operation->ctx.sha512, hash );
            break;
#endif
        default:
            return( PSA_ERROR_BAD_STATE );
    }
    status = mbedtls_to_psa_error( ret );

exit:
    if( status == PSA_SUCCESS )
    {
        *hash_length = actual_hash_length;
        return( psa_hash_abort( operation ) );
    }
    else
    {
        psa_hash_abort( operation );
        return( status );
    }
}